

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_LdArrGeneric<Js::OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  uint32 index;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (playout->ViewType < TYPE_COUNT) {
    index = *(uint32 *)(*(long *)(this + 0x118) + (ulong)playout->SlotIndex * 4);
    switch(playout->ViewType) {
    case TYPE_INT8:
      OP_LdArr<char,int>(this,index,playout->Value);
      return;
    case TYPE_UINT8:
      OP_LdArr<unsigned_char,int>(this,index,playout->Value);
      return;
    case TYPE_INT16:
      OP_LdArr<short,int>(this,index & 0xfffffffe,playout->Value);
      return;
    case TYPE_UINT16:
      OP_LdArr<unsigned_short,int>(this,index & 0xfffffffe,playout->Value);
      return;
    case TYPE_INT32:
      OP_LdArr<int,int>(this,index & 0xfffffffc,playout->Value);
      return;
    case TYPE_UINT32:
      OP_LdArr<unsigned_int,int>(this,index & 0xfffffffc,playout->Value);
      return;
    case TYPE_FLOAT32:
      OP_LdArr<float,float>(this,index & 0xfffffffc,playout->Value);
      return;
    case TYPE_FLOAT64:
      OP_LdArr<double,double>(this,index & 0xfffffff8,playout->Value);
      return;
    case TYPE_INT64:
      OP_LdArr<long,long>(this,index & 0xfffffff8,playout->Value);
      return;
    case TYPE_INT8_TO_INT64:
      OP_LdArr<char,long>(this,index,playout->Value);
      return;
    case TYPE_UINT8_TO_INT64:
      OP_LdArr<unsigned_char,long>(this,index,playout->Value);
      return;
    case TYPE_INT16_TO_INT64:
      OP_LdArr<short,long>(this,index & 0xfffffffe,playout->Value);
      return;
    case TYPE_UINT16_TO_INT64:
      OP_LdArr<unsigned_short,long>(this,index & 0xfffffffe,playout->Value);
      return;
    case TYPE_INT32_TO_INT64:
      OP_LdArr<int,long>(this,index & 0xfffffffc,playout->Value);
      return;
    case TYPE_UINT32_TO_INT64:
      OP_LdArr<unsigned_int,long>(this,index & 0xfffffffc,playout->Value);
      return;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                              ,0x231f,"((0))","UNREACHED");
  if (bVar2) {
    *puVar3 = 0;
    return;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void InterpreterStackFrame::OP_LdArrGeneric(const unaligned T* playout)
    {
        const uint32 index = (uint32)GetRegRawInt(playout->SlotIndex);
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: \
            OP_LdArr<MemType, RegType>(index & ARRAYBUFFER_VIEW_MASK(align), playout->Value); \
            return;
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
    }